

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::NegativeGLSLLinkTime::NegativeGLSLLinkTime(NegativeGLSLLinkTime *this)

{
  NegativeGLSLLinkTime *this_local;
  
  ShaderStorageBufferObjectBase::ShaderStorageBufferObjectBase
            (&this->super_ShaderStorageBufferObjectBase);
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__NegativeGLSLLinkTime_03243830;
  return;
}

Assistant:

virtual long Run()
	{
		//   declaration of "x" conflicts with previous declaration at 0(4)
		//   declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { uint x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  y += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "g_buffer" conflicts with previous declaration at 0(4)
		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; } g_buffer[2];" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  g_buffer[0].x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; } g_buffer[3];" NL "void Run() {" NL
				  "  g_buffer[1].x += 3;" NL "}"))
			return ERROR;

		return NO_ERROR;
	}